

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

Char __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::NextChar
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  code *pcVar1;
  bool bVar2;
  OLECHAR OVar3;
  undefined4 *puVar4;
  EncodedCharPtr last;
  
  last = this->inputLim;
  if (last <= this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x25d,"(!IsEOF())","!IsEOF()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    last = this->inputLim;
  }
  OVar3 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                    (&this->super_UTF8EncodingPolicyBase<false>,&this->next,last);
  return OVar3;
}

Assistant:

inline char16 Parser<P, IsLiteral>::NextChar()
    {
        Assert(!IsEOF());
        // Could be an embedded 0
        Char c = this->template ReadFull<true>(next, inputLim);
        // No embedded newlines in literals
        if (IsLiteral && standardChars->IsNewline(c))
            Fail(ERRnoSlash);
        return c;
    }